

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int vdbeSorterFlushPMA(VdbeSorter *pSorter)

{
  SortSubtask *pSVar1;
  u8 *puVar2;
  undefined4 uVar3;
  int iVar4;
  u8 *puVar5;
  ulong uVar6;
  int iVar7;
  long lVar8;
  int iVar9;
  int iVar10;
  SortSubtask *pTask;
  
  lVar8 = (ulong)pSorter->nTask - 1;
  pSorter->bUsePMA = '\x01';
  pTask = (SortSubtask *)0x0;
  iVar7 = (int)lVar8;
  iVar10 = 0;
  if (0 < iVar7) {
    iVar10 = iVar7;
  }
  pSVar1 = pSorter->aTask;
  iVar4 = 1;
  do {
    iVar9 = iVar4;
    if (iVar9 - iVar10 == 1) goto LAB_00133a27;
    uVar6 = (long)(int)((uint)pSorter->iPrev + iVar9) % (long)iVar7 & 0xffffffff;
    pTask = pSVar1 + uVar6;
    if ((pSorter->aTask[uVar6].bDone != 0) && (iVar4 = vdbeSorterJoinThread(pTask), iVar4 != 0)) {
      return iVar4;
    }
    iVar4 = iVar9 + 1;
  } while (pTask->pThread != (SQLiteThread *)0x0);
  iVar10 = iVar9 + -1;
LAB_00133a27:
  if (iVar10 == iVar7) {
    iVar10 = vdbeSorterListToPMA(pSVar1 + lVar8,&pSorter->list);
    return iVar10;
  }
  puVar5 = (pTask->list).aMemory;
  pSorter->iPrev = (u8)(((long)pTask - (long)pSVar1) / 0x68);
  uVar3 = *(undefined4 *)&(pSorter->list).field_0x14;
  (pTask->list).szPMA = (pSorter->list).szPMA;
  *(undefined4 *)&(pTask->list).field_0x14 = uVar3;
  puVar2 = (pSorter->list).aMemory;
  (pTask->list).pList = (pSorter->list).pList;
  (pTask->list).aMemory = puVar2;
  (pSorter->list).pList = (SorterRecord *)0x0;
  (pSorter->list).szPMA = 0;
  if (puVar5 == (u8 *)0x0) {
    if ((pSorter->list).aMemory != (u8 *)0x0) {
      puVar5 = (u8 *)sqlite3Malloc((long)pSorter->nMemory);
      (pSorter->list).aMemory = puVar5;
      if (puVar5 == (u8 *)0x0) {
        return 7;
      }
    }
  }
  else {
    (pSorter->list).aMemory = puVar5;
    iVar10 = (*sqlite3Config.m.xSize)(puVar5);
    pSorter->nMemory = iVar10;
  }
  iVar10 = vdbeSorterCreateThread(pTask,vdbeSorterFlushThread,pTask);
  return iVar10;
}

Assistant:

static int vdbeSorterFlushPMA(VdbeSorter *pSorter){
#if SQLITE_MAX_WORKER_THREADS==0
  pSorter->bUsePMA = 1;
  return vdbeSorterListToPMA(&pSorter->aTask[0], &pSorter->list);
#else
  int rc = SQLITE_OK;
  int i;
  SortSubtask *pTask = 0;    /* Thread context used to create new PMA */
  int nWorker = (pSorter->nTask-1);

  /* Set the flag to indicate that at least one PMA has been written. 
  ** Or will be, anyhow.  */
  pSorter->bUsePMA = 1;

  /* Select a sub-task to sort and flush the current list of in-memory
  ** records to disk. If the sorter is running in multi-threaded mode,
  ** round-robin between the first (pSorter->nTask-1) tasks. Except, if
  ** the background thread from a sub-tasks previous turn is still running,
  ** skip it. If the first (pSorter->nTask-1) sub-tasks are all still busy,
  ** fall back to using the final sub-task. The first (pSorter->nTask-1)
  ** sub-tasks are prefered as they use background threads - the final 
  ** sub-task uses the main thread. */
  for(i=0; i<nWorker; i++){
    int iTest = (pSorter->iPrev + i + 1) % nWorker;
    pTask = &pSorter->aTask[iTest];
    if( pTask->bDone ){
      rc = vdbeSorterJoinThread(pTask);
    }
    if( rc!=SQLITE_OK || pTask->pThread==0 ) break;
  }

  if( rc==SQLITE_OK ){
    if( i==nWorker ){
      /* Use the foreground thread for this operation */
      rc = vdbeSorterListToPMA(&pSorter->aTask[nWorker], &pSorter->list);
    }else{
      /* Launch a background thread for this operation */
      u8 *aMem = pTask->list.aMemory;
      void *pCtx = (void*)pTask;

      assert( pTask->pThread==0 && pTask->bDone==0 );
      assert( pTask->list.pList==0 );
      assert( pTask->list.aMemory==0 || pSorter->list.aMemory!=0 );

      pSorter->iPrev = (u8)(pTask - pSorter->aTask);
      pTask->list = pSorter->list;
      pSorter->list.pList = 0;
      pSorter->list.szPMA = 0;
      if( aMem ){
        pSorter->list.aMemory = aMem;
        pSorter->nMemory = sqlite3MallocSize(aMem);
      }else if( pSorter->list.aMemory ){
        pSorter->list.aMemory = sqlite3Malloc(pSorter->nMemory);
        if( !pSorter->list.aMemory ) return SQLITE_NOMEM_BKPT;
      }

      rc = vdbeSorterCreateThread(pTask, vdbeSorterFlushThread, pCtx);
    }
  }

  return rc;
#endif /* SQLITE_MAX_WORKER_THREADS!=0 */
}